

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

void duckdb::DateTruncFunction<duckdb::date_t,duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  unsigned_long *puVar1;
  idx_t count;
  DatePartSpecifier DVar2;
  reference left;
  reference right;
  NotImplementedException *this;
  allocator local_49;
  string local_48;
  
  left = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  right = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  if (left->vector_type != CONSTANT_VECTOR) {
    BinaryExecutor::
    ExecuteStandard<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t,duckdb::DateTruncBinaryOperator>
              (left,right,result,args->count);
    return;
  }
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  string_t::GetString_abi_cxx11_(&local_48,(string_t *)left->data);
  DVar2 = GetDatePartSpecifier(&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  if (DVar2 < BEGIN_INVALID) {
    count = args->count;
    switch(DVar2) {
    case BEGIN_BIGINT:
      DateTrunc::UnaryExecute<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::YearOperator>
                (right,result,count);
      break;
    case MONTH:
      DateTrunc::UnaryExecute<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::MonthOperator>
                (right,result,count);
      break;
    default:
      DateTrunc::UnaryExecute<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::DayOperator>
                (right,result,count);
      break;
    case DECADE:
      DateTrunc::UnaryExecute<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::DecadeOperator>
                (right,result,count);
      break;
    case CENTURY:
      DateTrunc::UnaryExecute<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::CenturyOperator>
                (right,result,count);
      break;
    case MILLENNIUM:
      DateTrunc::
      UnaryExecute<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::MillenniumOperator>
                (right,result,count);
      break;
    case MICROSECONDS:
      DateTrunc::
      UnaryExecute<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::MicrosecondOperator>
                (right,result,count);
      break;
    case MILLISECONDS:
      DateTrunc::
      UnaryExecute<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::MillisecondOperator>
                (right,result,count);
      break;
    case SECOND:
    case BEGIN_DOUBLE:
      DateTrunc::UnaryExecute<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::SecondOperator>
                (right,result,count);
      break;
    case MINUTE:
      DateTrunc::UnaryExecute<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::MinuteOperator>
                (right,result,count);
      break;
    case HOUR:
      DateTrunc::UnaryExecute<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::HourOperator>
                (right,result,count);
      break;
    case WEEK:
    case YEARWEEK:
      DateTrunc::UnaryExecute<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::WeekOperator>
                (right,result,count);
      break;
    case ISOYEAR:
      DateTrunc::UnaryExecute<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::ISOYearOperator>
                (right,result,count);
      break;
    case QUARTER:
      DateTrunc::UnaryExecute<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::QuarterOperator>
                (right,result,count);
      break;
    case ERA:
    case TIMEZONE:
    case TIMEZONE_HOUR:
    case TIMEZONE_MINUTE:
      goto switchD_01d7d994_caseD_12;
    }
    return;
  }
switchD_01d7d994_caseD_12:
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,"Specifier type not implemented for DATETRUNC",&local_49);
  NotImplementedException::NotImplementedException(this,(string *)&local_48);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void DateTruncFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &part_arg = args.data[0];
	auto &date_arg = args.data[1];

	if (part_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		// Common case of constant part.
		if (ConstantVector::IsNull(part_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			const auto type = GetDatePartSpecifier(ConstantVector::GetData<string_t>(part_arg)->GetString());
			DateTruncUnaryExecutor<TA, TR>(type, date_arg, result, args.size());
		}
	} else {
		BinaryExecutor::ExecuteStandard<string_t, TA, TR, DateTruncBinaryOperator>(part_arg, date_arg, result,
		                                                                           args.size());
	}
}